

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O3

void kv_set_key_test(void)

{
  int iVar1;
  ushort *puVar2;
  undefined8 *extraout_RDX;
  __suseconds_t *__s1;
  char *pcVar3;
  char *pcVar4;
  char *__s2;
  __suseconds_t *key;
  undefined8 unaff_R12;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined8 local_48;
  undefined3 uStack_40;
  undefined5 uStack_3d;
  undefined1 local_38 [8];
  timeval __test_begin;
  char acStack_20 [8];
  char str [11];
  
  __s1 = (__suseconds_t *)local_38;
  stack0xffffffffffffffbf = CONCAT31(0x102aea,local_48._7_1_);
  uStack_3d = 0;
  gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
  stack0xffffffffffffffbf = CONCAT31(0x102aef,local_48._7_1_);
  uStack_3d = 0;
  memleak_start();
  __s2 = acStack_20;
  acStack_20[0] = 't';
  acStack_20[1] = 'e';
  acStack_20[2] = 's';
  acStack_20[3] = 't';
  acStack_20[4] = 's';
  acStack_20[5] = 't';
  acStack_20[6] = 'r';
  stack0xffffffffffffffe7 = 0x676e69;
  key = &__test_begin.tv_usec;
  stack0xffffffffffffffbf = CONCAT31(0x102b18,local_48._7_1_);
  uStack_3d = 0;
  btree_str_kv_set_key(key,__s2,0xb);
  if (*(short *)__test_begin.tv_usec == 0xb00) {
    __s1 = &local_48;
    local_48._0_7_ = (undefined7)*(undefined8 *)(__test_begin.tv_usec + 2);
    uStack_40 = (undefined3)((uint)*(undefined4 *)(__test_begin.tv_usec + 9) >> 8);
    local_48._7_1_ = (undefined1)((ulong)*(undefined8 *)(__test_begin.tv_usec + 2) >> 0x38);
    __s2 = acStack_20;
    key = __s1;
    iVar1 = strcmp((char *)__s1,__s2);
    if (iVar1 == 0) {
      kv_set_key_test();
      return;
    }
  }
  else {
    stack0xffffffffffffffbf = CONCAT31(0x102b63,local_48._7_1_);
    uStack_3d = 0;
    kv_set_key_test();
  }
  ((timeval *)(__s1 + -1))->tv_sec = (__time_t)construct_key_ptr;
  kv_set_key_test();
  ((timeval *)(__s1 + -1))->tv_sec = (__time_t)&stack0xfffffffffffffff8;
  __s1[-2] = unaff_R15;
  __s1[-3] = unaff_R14;
  __s1[-4] = unaff_R12;
  __s1[-5] = __test_begin.tv_usec;
  pcVar3 = (char *)(__s1 + -6);
  pcVar3[0] = -0x7c;
  pcVar3[1] = '+';
  pcVar3[2] = '\x10';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  puVar2 = (ushort *)malloc(((ulong)__s2 & 0xffffffff) + 2);
  *puVar2 = (ushort)__s2 << 8 | (ushort)__s2 >> 8;
  pcVar4 = (char *)(__s1 + -6);
  pcVar4[0] = -99;
  pcVar4[1] = '+';
  pcVar4[2] = '\x10';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  memcpy(puVar2 + 1,key,(ulong)__s2 & 0xffffffff);
  *extraout_RDX = puVar2;
  return;
}

Assistant:

void kv_set_key_test()
{

    TEST_INIT();
    memleak_start();

    char str[] = "teststring";
    uint8_t *key = alca(uint8_t, sizeof(void *));
    size_t str_len = sizeof(str);

    // set key ptr
    btree_str_kv_set_key(key, str, str_len);
    void *kv_addr;
    memcpy(&kv_addr, key, sizeof(void *));

    // check key len
    key_len_t kv_len;
    memcpy(&kv_len, (key_len_t *)kv_addr, sizeof(key_len_t));
    key_len_t kv_len_dec = _endian_decode(kv_len);
    TEST_CHK(kv_len_dec == str_len);

    // check key size
    char *kv_str = alca(char, str_len);
    TEST_CHK(kv_str != NULL);
    memcpy(kv_str, ((char *)kv_addr) + sizeof(key_len_t), str_len);
    int cmp = strcmp(kv_str, str);
    TEST_CHK(cmp == 0);
    free(kv_addr);

    memleak_end();
    TEST_RESULT("kv set key test");
}